

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  char *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  reference __s;
  size_t __maxlen;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000011;
  char *local_110;
  int local_dc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0;
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  undefined8 local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  ulong local_50;
  size_t wouldPrint;
  int local_3c;
  allocator local_36;
  undefined1 local_35;
  int len;
  allocator local_25;
  uint local_24;
  uint local_20;
  PrecisionType precisionType_local;
  uint precision_local;
  bool useSpecialFloats_local;
  double value_local;
  String *buffer;
  
  precisionType_local._3_1_ = (char)this & 1;
  local_20 = (uint)CONCAT71(in_register_00000011,useSpecialFloats);
  local_24 = precision;
  _precision_local = value;
  value_local = (double)__return_storage_ptr__;
  bVar3 = std::isfinite(value);
  if (bVar3) {
    local_35 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,0x24,'\0',&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    while( true ) {
      wouldPrint = std::__cxx11::string::begin();
      __s = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&wouldPrint);
      __maxlen = std::__cxx11::string::size();
      if (local_24 == 0) {
        local_110 = "%.*g";
      }
      else {
        local_110 = "%.*f";
      }
      local_3c = snprintf(__s,__maxlen,local_110,_precision_local,(ulong)local_20);
      if (local_3c < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x92,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      uVar5 = (ulong)local_3c;
      local_50 = uVar5;
      uVar6 = std::__cxx11::string::size();
      if (uVar5 < uVar6) break;
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    local_68._M_current = (char *)std::__cxx11::string::begin();
    local_70 = (char *)std::__cxx11::string::end();
    local_60 = fixNumericLocale<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (local_68,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_70);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
    local_80._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
    local_88 = std::__cxx11::string::erase(__return_storage_ptr__,local_58,local_78);
    lVar7 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if ((lVar7 == -1) &&
       (lVar7 = std::__cxx11::string::find((char)__return_storage_ptr__,0x65), lVar7 == -1)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".0");
    }
    if (local_24 == 1) {
      local_a0._M_current = (char *)std::__cxx11::string::begin();
      local_a8 = (char *)std::__cxx11::string::end();
      local_98 = fixZerosInTheEnd<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (local_a0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_a8,local_20);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
      local_b8._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,&local_b8);
      std::__cxx11::string::erase(__return_storage_ptr__,local_90,local_b0);
    }
  }
  else {
    uVar2 = precisionType_local._3_1_ & 1;
    uVar4 = std::isnan(_precision_local);
    if ((uVar4 & 1) == 0) {
      local_dc = 2;
      if (_precision_local < 0.0) {
        local_dc = 1;
      }
    }
    else {
      local_dc = 0;
    }
    pcVar1 = anon_unknown_5::valueToString::reps[(int)(uint)(uVar2 == significantDigits >> 0x18)]
             [local_dc];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

String valueToString(double value, bool useSpecialFloats,
                     unsigned int precision, PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1][isnan(value)  ? 0
                                          : (value < 0) ? 1
                                                        : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end(), precision),
                 buffer.end());
  }

  return buffer;
}